

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O1

bool tinyusdz::tydra::(anonymous_namespace)::(anonymous_namespace)::
     ScalarValueToVertexAttribute<std::array<unsigned_short,2ul>>
               (Value *value,string *name,VertexAttributeFormat format,VertexAttribute *dst,
               string *err)

{
  array<unsigned_short,_2UL> *paVar1;
  ostream *poVar2;
  undefined4 in_register_00000014;
  string *psVar3;
  ostringstream ss_e;
  long *local_1c0;
  long local_1b0 [2];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  psVar3 = (string *)CONCAT44(in_register_00000014,format);
  paVar1 = tinyusdz::value::Value::as<std::array<unsigned_short,2ul>>(value,false);
  if (paVar1 != (array<unsigned_short,_2UL> *)0x0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(psVar3 + 0x30),4);
    **(undefined4 **)(psVar3 + 0x30) = *(undefined4 *)paVar1->_M_elems;
    *(undefined4 *)(psVar3 + 0x28) = 0;
    *(undefined8 *)(psVar3 + 0x20) = 0x10000000e;
    *(undefined4 *)(psVar3 + 0x60) = 0;
    ::std::__cxx11::string::_M_assign(psVar3);
    if (*(long *)(psVar3 + 0x50) != *(long *)(psVar3 + 0x48)) {
      *(long *)(psVar3 + 0x50) = *(long *)(psVar3 + 0x48);
    }
    if (paVar1 != (array<unsigned_short,_2UL> *)0x0) goto LAB_003738de;
  }
  ::std::__cxx11::ostringstream::ostringstream(local_1a0);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[error]",7);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
             ,0x5b);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"ScalarValueToVertexAttribute",0x1c);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"():",3);
  poVar2 = (ostream *)::std::ostream::operator<<(local_1a0,0x4a2);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"[Internal error] value is not scalar-typed value.",0x31);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
  if (dst != (VertexAttribute *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)dst,(ulong)local_1c0);
    if (local_1c0 != local_1b0) {
      operator_delete(local_1c0,local_1b0[0] + 1);
    }
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
  ::std::ios_base::~ios_base(local_130);
LAB_003738de:
  return paVar1 != (array<unsigned_short,_2UL> *)0x0;
}

Assistant:

bool ScalarValueToVertexAttribute(const value::Value &value,
                                  const std::string &name,
                                  const VertexAttributeFormat format,
                                  VertexAttribute &dst, std::string *err) {
  if (VertexAttributeFormatSize(format) != sizeof(UnderlyingTy)) {
    PUSH_ERROR_AND_RETURN("format size mismatch.");
    return false;
  }

  if (auto pv = value.as<UnderlyingTy>()) {
    dst.data.resize(sizeof(UnderlyingTy));
    memcpy(dst.data.data(), pv, sizeof(UnderlyingTy));

    dst.elementSize = 1;
    dst.stride = 0;
    dst.format = format;
    dst.variability = VertexVariability::Constant;
    dst.name = name;
    dst.indices.clear();
    return true;
  }

  PUSH_ERROR_AND_RETURN("[Internal error] value is not scalar-typed value.");
}